

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void slot_error(char *error_string,Am_Slot_Data *slot)

{
  uint *puVar1;
  ostream *poVar2;
  Am_Object obj;
  Am_Object local_18;
  
  local_18.data = slot->context;
  puVar1 = &((local_18.data)->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 + 1;
  poVar2 = std::operator<<((ostream *)&std::cerr,"** ");
  poVar2 = std::operator<<(poVar2,error_string);
  poVar2 = std::operator<<(poVar2,"  Object = ");
  Am_Object::Print(&local_18,poVar2);
  std::operator<<(poVar2,", Slot = ");
  Am_Print_Key((ostream *)&std::cerr,slot->key);
  poVar2 = std::operator<<((ostream *)&std::cerr,".");
  std::endl<char,std::char_traits<char>>(poVar2);
  Am_Error(&local_18,slot->key);
}

Assistant:

static void
slot_error(const char *error_string, Am_Slot_Data *slot)
{
  slot->context->Note_Reference();
  Am_Object obj = Am_Object(slot->context);
  std::cerr << "** " << error_string << "  Object = " << obj << ", Slot = ";
  Am_Print_Key(std::cerr, slot->key);
  std::cerr << "." << std::endl;
  Am_Error(obj, slot->key);
}